

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O0

void __thiscall
baryonyx::itm::debug_logger<true>::debug_logger(debug_logger<true> *this,string_view name)

{
  FILE *pFVar1;
  undefined8 *in_RDI;
  undefined1 auVar2 [64];
  type written;
  char buffer [512];
  id local_298;
  hash<std::thread::id> local_289;
  size_t local_288;
  type local_280;
  undefined1 local_270 [64];
  undefined1 local_230 [64];
  undefined1 local_1f0 [64];
  undefined1 local_1b0 [64];
  undefined1 local_170 [64];
  undefined1 local_130 [64];
  undefined1 local_f0 [64];
  undefined1 local_b0 [64];
  basic_string_view<char,_std::char_traits<char>_> local_60 [5];
  
  *in_RDI = 0;
  auVar2 = ZEXT1664((undefined1  [16])0x0);
  local_b0 = vmovdqu64_avx512f(auVar2);
  local_f0 = vmovdqu64_avx512f(auVar2);
  local_130 = vmovdqu64_avx512f(auVar2);
  local_170 = vmovdqu64_avx512f(auVar2);
  local_1b0 = vmovdqu64_avx512f(auVar2);
  local_1f0 = vmovdqu64_avx512f(auVar2);
  local_230 = vmovdqu64_avx512f(auVar2);
  local_270 = vmovdqu64_avx512f(auVar2);
  local_298 = std::this_thread::get_id();
  local_288 = std::hash<std::thread::id>::operator()(&local_289,&local_298);
  local_280 = ::fmt::v7::
              format_to_n<char*,char[10],std::basic_string_view<char,std::char_traits<char>>,unsigned_long,true>
                        (local_270,0x1ff,(char (*) [10])"{}-{}.log",local_60,&local_288);
  local_270[local_280.size] = 0;
  pFVar1 = fopen(local_270,"w");
  *in_RDI = pFVar1;
  return;
}

Assistant:

debug_logger(const std::string_view name) noexcept
    {
        if constexpr (debug) {
            char buffer[512] = { '\0' };

            auto written = fmt::format_to_n(
              buffer,
              511,
              "{}-{}.log",
              name,
              std::hash<std::thread::id>{}(std::this_thread::get_id()));

            buffer[written.size] = '\0';

            ofs = std::fopen(buffer, "w");
        } else {
            (void)name;

            ofs = nullptr;
        }
    }